

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O1

int lua_resume(lua_State *L,lua_State *from,int nargs,int *nresults)

{
  byte bVar1;
  uint uVar2;
  anon_union_4_3_18ab96e6_for_u2 aVar3;
  TString *pTVar4;
  CallInfo *pCVar5;
  char *pcVar6;
  TValue *io_2;
  StkId pSVar7;
  StkId pSVar8;
  TValue *io;
  int local_2c;
  
  local_2c = nargs;
  if (L->status == '\x01') {
LAB_0010c098:
    if (from == (lua_State *)0x0) {
      uVar2 = 0;
    }
    else {
      uVar2 = (uint)(ushort)from->nCcalls;
    }
    L->nCcalls = uVar2;
    if (uVar2 < 200) {
      L->nCcalls = uVar2 + 1;
      bVar1 = luaD_rawrunprotected(L,resume,&local_2c);
      while (1 < bVar1) {
        for (pCVar5 = L->ci; pCVar5 != (CallInfo *)0x0; pCVar5 = pCVar5->previous) {
          if ((pCVar5->callstatus & 0x200000) != 0) goto LAB_0010c146;
        }
        pCVar5 = (CallInfo *)0x0;
LAB_0010c146:
        if (pCVar5 == (CallInfo *)0x0) break;
        L->ci = pCVar5;
        pCVar5->callstatus = (uint)bVar1 << 0xc | pCVar5->callstatus & 0xffff8fff;
        bVar1 = luaD_rawrunprotected(L,unroll,(void *)0x0);
      }
      if (1 < bVar1) {
        lua_resume_cold_1();
      }
      if (bVar1 == 1) {
        aVar3 = L->ci->u2;
      }
      else {
        aVar3.funcidx = (int)((ulong)((long)(L->top).p + (-0x10 - (L->ci->func).offset)) >> 4);
      }
      *nresults = (int)aVar3;
      return (uint)bVar1;
    }
    pSVar8 = (L->top).p;
    pSVar7 = pSVar8 + -(long)nargs;
    (L->top).p = pSVar7;
    pcVar6 = "C stack overflow";
  }
  else {
    if (L->status == '\0') {
      pSVar8 = (L->top).p;
      if (L->ci == &L->base_ci) {
        if ((long)pSVar8 + (-0x10 - (L->ci->func).offset) >> 4 != (long)nargs) goto LAB_0010c098;
        pSVar8 = pSVar8 + -(long)nargs;
        (L->top).p = pSVar8;
        pcVar6 = "cannot resume dead coroutine";
      }
      else {
        pSVar8 = pSVar8 + -(long)nargs;
        (L->top).p = pSVar8;
        pcVar6 = "cannot resume non-suspended coroutine";
      }
      pTVar4 = luaS_new(L,pcVar6);
      *(TString **)pSVar8 = pTVar4;
      (pSVar8->val).tt_ = pTVar4->tt | 0x40;
      goto LAB_0010c0ea;
    }
    pSVar8 = (L->top).p;
    pSVar7 = pSVar8 + -(long)nargs;
    (L->top).p = pSVar7;
    pcVar6 = "cannot resume dead coroutine";
  }
  pTVar4 = luaS_new(L,pcVar6);
  *(TString **)pSVar7 = pTVar4;
  *(byte *)((long)pSVar8 + (long)nargs * -0x10 + 8) = pTVar4->tt | 0x40;
LAB_0010c0ea:
  (L->top).p = (StkId)((L->top).offset + 0x10);
  return 2;
}

Assistant:

LUA_API int lua_resume (lua_State *L, lua_State *from, int nargs,
                                      int *nresults) {
  TStatus status;
  lua_lock(L);
  if (L->status == LUA_OK) {  /* may be starting a coroutine */
    if (L->ci != &L->base_ci)  /* not in base level? */
      return resume_error(L, "cannot resume non-suspended coroutine", nargs);
    else if (L->top.p - (L->ci->func.p + 1) == nargs)  /* no function? */
      return resume_error(L, "cannot resume dead coroutine", nargs);
  }
  else if (L->status != LUA_YIELD)  /* ended with errors? */
    return resume_error(L, "cannot resume dead coroutine", nargs);
  L->nCcalls = (from) ? getCcalls(from) : 0;
  if (getCcalls(L) >= LUAI_MAXCCALLS)
    return resume_error(L, "C stack overflow", nargs);
  L->nCcalls++;
  luai_userstateresume(L, nargs);
  api_checkpop(L, (L->status == LUA_OK) ? nargs + 1 : nargs);
  status = luaD_rawrunprotected(L, resume, &nargs);
   /* continue running after recoverable errors */
  status = precover(L, status);
  if (l_likely(!errorstatus(status)))
    lua_assert(status == L->status);  /* normal end or yield */
  else {  /* unrecoverable error */
    L->status = status;  /* mark thread as 'dead' */
    luaD_seterrorobj(L, status, L->top.p);  /* push error message */
    L->ci->top.p = L->top.p;
  }
  *nresults = (status == LUA_YIELD) ? L->ci->u2.nyield
                                    : cast_int(L->top.p - (L->ci->func.p + 1));
  lua_unlock(L);
  return APIstatus(status);
}